

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_int * ImVector_int_ImVector_intVector(ImVector_int *src)

{
  uint uVar1;
  ImVector_int *pIVar2;
  int *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_int *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (int *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (int *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (int *)ImGui::MemAlloc(uVar3 * 4);
    if (pIVar2->Data != (int *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 2);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 << 2);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_int* ImVector_int_ImVector_intVector(const ImVector_int src)
{
    return IM_NEW(ImVector_int)(src);
}